

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::DecimalQuantity::readDoubleConversionToBcd
          (DecimalQuantity *this,char *buffer,int32_t length,int32_t point)

{
  int local_34;
  ulong uStack_30;
  int32_t i_1;
  uint64_t result;
  int32_t i;
  int32_t point_local;
  int32_t length_local;
  char *buffer_local;
  DecimalQuantity *this_local;
  
  if (length < 0x11) {
    uStack_30 = 0;
    for (local_34 = 0; local_34 < length; local_34 = local_34 + 1) {
      uStack_30 = (long)(buffer[(length - local_34) + -1] + -0x30) << ((byte)(local_34 << 2) & 0x3f)
                  | uStack_30;
    }
    (this->fBCD).bcdLong = uStack_30;
  }
  else {
    ensureCapacity(this,length);
    for (result._4_4_ = 0; result._4_4_ < length; result._4_4_ = result._4_4_ + 1) {
      (this->fBCD).bcdBytes.ptr[result._4_4_] = buffer[(length - result._4_4_) + -1] + -0x30;
    }
  }
  this->scale = point - length;
  this->precision = length;
  return;
}

Assistant:

void DecimalQuantity::readDoubleConversionToBcd(
        const char* buffer, int32_t length, int32_t point) {
    // NOTE: Despite the fact that double-conversion's API is called
    // "DoubleToAscii", they actually use '0' (as opposed to u8'0').
    if (length > 16) {
        ensureCapacity(length);
        for (int32_t i = 0; i < length; i++) {
            fBCD.bcdBytes.ptr[i] = buffer[length-i-1] - '0';
        }
    } else {
        uint64_t result = 0L;
        for (int32_t i = 0; i < length; i++) {
            result |= static_cast<uint64_t>(buffer[length-i-1] - '0') << (4 * i);
        }
        fBCD.bcdLong = result;
    }
    scale = point - length;
    precision = length;
}